

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling3D::make_padding
          (Pooling3D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  int *piVar1;
  void *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  Option opt_b_3;
  int dpad_1;
  int hpad_1;
  int wpad_1;
  Option opt_b_2;
  int dpad;
  int hpad;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int dtail;
  int htail;
  int wtail;
  int dtailpad;
  int htailpad;
  int wtailpad;
  float pad_value;
  int d;
  int h;
  int w;
  float in_stack_fffffffffffffe24;
  float v;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int left;
  int in_stack_fffffffffffffe30;
  int bottom;
  int in_stack_fffffffffffffe34;
  int top;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Mat *in_stack_fffffffffffffe40;
  int front;
  Mat *pMVar2;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  Option *in_stack_fffffffffffffe68;
  undefined1 local_158 [8];
  undefined8 local_150;
  int local_114;
  int local_110;
  int local_10c;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined4 local_70;
  int local_6c;
  int local_68;
  int local_64;
  void *local_60;
  Mat *local_50;
  int local_40;
  undefined4 local_3c;
  Mat *local_38;
  Mat *local_28;
  int local_20;
  undefined4 local_1c;
  void *local_10;
  
  local_64 = in_RSI->w;
  local_68 = in_RSI->h;
  local_6c = in_RSI->d;
  local_60 = in_RCX;
  local_50 = in_RSI;
  local_28 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI->refcount != (int *)0x0) {
      piVar1 = in_RSI->refcount;
      local_3c = 1;
      LOCK();
      local_40 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    pMVar2 = in_RDX;
    local_38 = in_RSI;
    if (in_RDX->refcount != (int *)0x0) {
      piVar1 = in_RDX->refcount;
      local_1c = 0xffffffff;
      LOCK();
      local_20 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_20 == 1) {
        if (in_RDX->allocator == (Allocator *)0x0) {
          local_10 = in_RDX->data;
          if (local_10 != (void *)0x0) {
            free(local_10);
          }
        }
        else {
          (*in_RDX->allocator->_vptr_Allocator[3])(in_RDX->allocator,in_RDX->data);
        }
      }
    }
    in_RDX->data = (void *)0x0;
    in_RDX->elemsize = 0;
    in_RDX->elempack = 0;
    in_RDX->dims = 0;
    in_RDX->w = 0;
    in_RDX->h = 0;
    in_RDX->d = 0;
    in_RDX->c = 0;
    in_RDX->cstep = 0;
    in_RDX->refcount = (int *)0x0;
    pMVar2->data = local_38->data;
    pMVar2->refcount = local_38->refcount;
    pMVar2->elemsize = local_38->elemsize;
    pMVar2->elempack = local_38->elempack;
    pMVar2->allocator = local_38->allocator;
    pMVar2->dims = local_38->dims;
    pMVar2->w = local_38->w;
    pMVar2->h = local_38->h;
    pMVar2->d = local_38->d;
    pMVar2->c = local_38->c;
    pMVar2->cstep = local_38->cstep;
    in_stack_fffffffffffffe40 = in_RDX;
    local_28 = pMVar2;
  }
  front = (int)local_28;
  if (*(int *)(in_RDI + 0xd0) == 0) {
    in_stack_fffffffffffffe38 = 0xff7fffff;
    in_stack_fffffffffffffe3c = 0xc3000000;
    local_70 = in_stack_fffffffffffffe3c;
    if (local_50->elemsize != 1) {
      in_stack_fffffffffffffe3c = 0xff7fffff;
      local_70 = in_stack_fffffffffffffe3c;
    }
  }
  else {
    local_70 = 0;
  }
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  if (*(int *)(in_RDI + 0x108) == 0) {
    local_80 = ((local_64 + *(int *)(in_RDI + 0xec) + *(int *)(in_RDI + 0xf0)) -
               *(int *)(in_RDI + 0xd4)) % *(int *)(in_RDI + 0xe0);
    local_84 = ((local_68 + *(int *)(in_RDI + 0xf4) + *(int *)(in_RDI + 0xf8)) -
               *(int *)(in_RDI + 0xd8)) % *(int *)(in_RDI + 0xe4);
    local_88 = ((local_6c + *(int *)(in_RDI + 0xfc) + *(int *)(in_RDI + 0x100)) -
               *(int *)(in_RDI + 0xdc)) % *(int *)(in_RDI + 0xe8);
    if (local_80 != 0) {
      local_74 = *(int *)(in_RDI + 0xe0) - local_80;
    }
    if (local_84 != 0) {
      local_78 = *(int *)(in_RDI + 0xe4) - local_84;
    }
    if (local_88 != 0) {
      local_7c = *(int *)(in_RDI + 0xe8) - local_88;
    }
    memcpy(local_c8,local_60,0x40);
    local_c0 = *(undefined8 *)((long)local_60 + 0x10);
    copy_make_border_3d(in_stack_fffffffffffffe40,
                        (Mat *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                        in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,front,
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe24,in_stack_fffffffffffffe68);
  }
  else if (*(int *)(in_RDI + 0x108) == 1) {
    memcpy(local_108,local_60,0x40);
    local_100 = *(undefined8 *)((long)local_60 + 0x10);
    copy_make_border_3d(in_stack_fffffffffffffe40,
                        (Mat *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                        in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                        in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,front,
                        in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,
                        in_stack_fffffffffffffe24,in_stack_fffffffffffffe68);
  }
  else if (*(int *)(in_RDI + 0x108) == 2) {
    left = *(int *)(in_RDI + 0xd4);
    local_10c = (left + ((local_64 + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0)) -
                local_64;
    bottom = *(int *)(in_RDI + 0xd8);
    local_110 = (bottom + ((local_68 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4)) -
                local_68;
    top = *(int *)(in_RDI + 0xdc);
    local_114 = (top + ((local_6c + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8)) -
                local_6c;
    if (((0 < local_10c) || (0 < local_110)) || (0 < local_114)) {
      memcpy(local_158,local_60,0x40);
      local_150 = *(undefined8 *)((long)local_60 + 0x10);
      copy_make_border_3d(in_stack_fffffffffffffe40,
                          (Mat *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),top,
                          bottom,left,local_110 / 2,front,in_stack_fffffffffffffe58,
                          in_stack_fffffffffffffe60,in_stack_fffffffffffffe24,
                          in_stack_fffffffffffffe68);
    }
  }
  else if (*(int *)(in_RDI + 0x108) == 3) {
    v = *(float *)(in_RDI + 0xdc);
    if (((0 < (*(int *)(in_RDI + 0xd4) +
              ((local_64 + -1) / *(int *)(in_RDI + 0xe0)) * *(int *)(in_RDI + 0xe0)) - local_64) ||
        (0 < (*(int *)(in_RDI + 0xd8) +
             ((local_68 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4)) - local_68)) ||
       (0 < ((int)v + ((local_6c + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8)) -
            local_6c)) {
      memcpy(&stack0xfffffffffffffe58,local_60,0x40);
      copy_make_border_3d(in_stack_fffffffffffffe40,
                          (Mat *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          in_stack_fffffffffffffe34,in_stack_fffffffffffffe30,
                          in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,front,
                          in_stack_fffffffffffffe58,(int)*(undefined8 *)((long)local_60 + 0x10),v,
                          in_stack_fffffffffffffe68);
    }
  }
  return;
}

Assistant:

void Pooling3D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;
    int dtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;
        int dtail = (d + pad_front + pad_behind - kernel_d) % stride_d;
        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;
        if (dtail != 0)
            dtailpad = stride_d - dtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, pad_front, pad_behind + dtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}